

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O1

void __thiscall IntVar::IntVar(IntVar *this,int _min,int _max)

{
  IntVar *local_10;
  
  (this->super_Var).super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020f8b8;
  this->var_id = engine.vars.sz;
  (this->min).v = _min;
  (this->max).v = _max;
  this->min0 = _min;
  this->max0 = _max;
  this->shadow_val = 0;
  this->in_scip = false;
  this->all_in_scip = true;
  this->should_be_learnable = true;
  this->should_be_decidable = true;
  this->vals = (Tchar *)0x0;
  this->preferred_val = PV_MIN;
  this->activity = 0.0;
  this->in_queue = false;
  (this->pinfo).sz = 0;
  (this->pinfo).cap = 0;
  (this->pinfo).data = (PropInfo *)0x0;
  this->sbps_value_selection = false;
  this->last_solution_value = -1;
  local_10 = this;
  vec<IntVar_*>::push(&engine.vars,&local_10);
  this->changes = (uint)((this->min).v == (this->max).v) * 8 + 7;
  return;
}

Assistant:

IntVar::IntVar(int _min, int _max)
		: var_id(engine.vars.size()), min(_min), max(_max), min0(_min), max0(_max) {
	assert(min_limit <= min && min <= max && max <= max_limit);
	engine.vars.push(this);
	changes = EVENT_C | EVENT_L | EVENT_U;
	if (isFixed()) {
		changes |= EVENT_F;
	}
}